

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void cmExtraEclipseCDT4Generator::AppendStorageScanners
               (cmGeneratedFileStream *fout,cmMakefile *makefile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  char *pcVar5;
  string compilerArgs;
  string arg1;
  string compiler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string make;
  
  compiler._M_dataplus._M_p = (pointer)&compiler.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&compiler,"CMAKE_MAKE_PROGRAM","");
  pcVar5 = cmMakefile::GetRequiredDefinition(makefile,&compiler);
  std::__cxx11::string::string((string *)&make,pcVar5,(allocator *)&arg1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compiler._M_dataplus._M_p != &compiler.field_2) {
    operator_delete(compiler._M_dataplus._M_p,compiler.field_2._M_allocated_capacity + 1);
  }
  arg1._M_dataplus._M_p = (pointer)&arg1.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&arg1,"CMAKE_C_COMPILER","");
  pcVar5 = cmMakefile::GetSafeDefinition(makefile,&arg1);
  std::__cxx11::string::string((string *)&compiler,pcVar5,(allocator *)&compilerArgs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg1._M_dataplus._M_p != &arg1.field_2) {
    operator_delete(arg1._M_dataplus._M_p,arg1.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &compilerArgs.field_2;
  compilerArgs._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&compilerArgs,"CMAKE_C_COMPILER_ARG1","");
  pcVar5 = cmMakefile::GetSafeDefinition(makefile,&compilerArgs);
  std::__cxx11::string::string((string *)&arg1,pcVar5,(allocator *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compilerArgs._M_dataplus._M_p != paVar1) {
    operator_delete(compilerArgs._M_dataplus._M_p,compilerArgs.field_2._M_allocated_capacity + 1);
  }
  if (compiler._M_string_length == 0) {
    compilerArgs._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&compilerArgs,"CMAKE_CXX_COMPILER","")
    ;
    pcVar5 = cmMakefile::GetSafeDefinition(makefile,&compilerArgs);
    sVar4 = compiler._M_string_length;
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)&compiler,0,(char *)sVar4,(ulong)pcVar5);
    paVar1 = &compilerArgs.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compilerArgs._M_dataplus._M_p != paVar1) {
      operator_delete(compilerArgs._M_dataplus._M_p,compilerArgs.field_2._M_allocated_capacity + 1);
    }
    compilerArgs._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&compilerArgs,"CMAKE_CXX_COMPILER_ARG1","");
    pcVar5 = cmMakefile::GetSafeDefinition(makefile,&compilerArgs);
    sVar4 = arg1._M_string_length;
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)&arg1,0,(char *)sVar4,(ulong)pcVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compilerArgs._M_dataplus._M_p != paVar1) {
      operator_delete(compilerArgs._M_dataplus._M_p,compilerArgs.field_2._M_allocated_capacity + 1);
    }
  }
  if (compiler._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&compiler,0,(char *)0x0,0x4b4208);
  }
  compilerArgs._M_dataplus._M_p = (pointer)&compilerArgs.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&compilerArgs,"-E -P -v -dD ${plugin_state_location}/${specs_file}","");
  if (arg1._M_string_length != 0) {
    std::__cxx11::string::append((char *)&arg1);
    std::operator+(&local_d0,&arg1,&compilerArgs);
    std::__cxx11::string::operator=((string *)&compilerArgs,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,
             "<storageModule moduleId=\"scannerConfiguration\">\n<autodiscovery enabled=\"true\" problemReportingEnabled=\"true\" selectedProfileId=\"org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile\"/>\n"
             ,0xbe);
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile","");
  paVar2 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  paVar3 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"specsFile","");
  AppendScannerProfile
            (fout,&local_d0,true,&local_90,true,&local_b0,&compilerArgs,&compiler,true,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"org.eclipse.cdt.make.core.GCCStandardMakePerFileProfile","");
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  local_b0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"makefileGenerator","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"-f ${project_name}_scd.mk","");
  AppendScannerProfile(fout,&local_d0,true,&local_90,true,&local_b0,&local_70,&make,true,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"</storageModule>\n",0x11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compilerArgs._M_dataplus._M_p != &compilerArgs.field_2) {
    operator_delete(compilerArgs._M_dataplus._M_p,compilerArgs.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg1._M_dataplus._M_p != &arg1.field_2) {
    operator_delete(arg1._M_dataplus._M_p,arg1.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compiler._M_dataplus._M_p != &compiler.field_2) {
    operator_delete(compiler._M_dataplus._M_p,compiler.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)make._M_dataplus._M_p != &make.field_2) {
    operator_delete(make._M_dataplus._M_p,make.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator
::AppendStorageScanners(cmGeneratedFileStream& fout,
                        const cmMakefile& makefile)
{
  // we need the "make" and the C (or C++) compiler which are used, Alex
  std::string make = makefile.GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler = makefile.GetSafeDefinition("CMAKE_C_COMPILER");
  std::string arg1 = makefile.GetSafeDefinition("CMAKE_C_COMPILER_ARG1");
  if (compiler.empty())
    {
    compiler = makefile.GetSafeDefinition("CMAKE_CXX_COMPILER");
    arg1 = makefile.GetSafeDefinition("CMAKE_CXX_COMPILER_ARG1");
    }
  if (compiler.empty())  //Hmm, what to do now ?
    {
    compiler = "gcc";
    }

  // the following right now hardcodes gcc behaviour :-/
  std::string compilerArgs =
                         "-E -P -v -dD ${plugin_state_location}/${specs_file}";
  if (!arg1.empty())
    {
    arg1 += " ";
    compilerArgs = arg1 + compilerArgs;
    }

  fout <<
    "<storageModule moduleId=\"scannerConfiguration\">\n"
    "<autodiscovery enabled=\"true\" problemReportingEnabled=\"true\""
    " selectedProfileId="
    "\"org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile\"/>\n"
    ;
  cmExtraEclipseCDT4Generator::AppendScannerProfile(fout,
    "org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile",
    true, "", true, "specsFile",
    compilerArgs,
    compiler, true, true);
  cmExtraEclipseCDT4Generator::AppendScannerProfile(fout,
    "org.eclipse.cdt.make.core.GCCStandardMakePerFileProfile",
    true, "", true, "makefileGenerator",
    "-f ${project_name}_scd.mk",
    make, true, true);

  fout << "</storageModule>\n";
}